

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_debug.h
# Opt level: O3

bool immutable::rrb_details::validate_subtree<char,false,5>
               (ref<immutable::rrb_details::tree_node<char,_false>_> *root,uint32_t expected_size,
               uint32_t root_shift)

{
  uint32_t uVar1;
  uint uVar2;
  internal_node<char,_false> *p_node;
  rrb_size_table<false> *prVar3;
  uint32_t *puVar4;
  bool bVar5;
  bool bVar6;
  uint32_t uVar7;
  byte bVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  ref<immutable::rrb_details::tree_node<char,_false>_> child;
  ref<immutable::rrb_details::tree_node<char,_false>_> local_48;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t local_34;
  
  uVar10 = (ulong)expected_size;
  p_node = (internal_node<char,_false> *)root->ptr;
  if (root_shift == 0) {
    if (p_node == (internal_node<char,_false> *)0x0) goto LAB_00143ed9;
    if (p_node->type != LEAF_NODE) {
      puts("Expected this node to be a leaf node, but it claims to be something else.");
      pcVar9 = "Will treat it like a leaf node, so may segfault.";
      goto LAB_00143d55;
    }
    uVar2 = p_node->len;
    uVar7 = p_node->_ref_count + 1;
    p_node->_ref_count = uVar7;
    if (uVar2 != expected_size) {
      uVar11 = uVar10;
      if (expected_size < uVar2) {
        uVar11 = (ulong)uVar2;
      }
      printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n"
             ,(ulong)uVar2,uVar10,uVar11);
      uVar7 = p_node->_ref_count;
    }
    p_node->_ref_count = uVar7 - 1;
    if (uVar7 == 1) {
      free(p_node);
    }
    if (uVar2 != expected_size) goto LAB_00143da5;
LAB_00143ec8:
    bVar5 = true;
  }
  else {
    if (p_node == (internal_node<char,_false> *)0x0) {
LAB_00143ed9:
      pcVar9 = 
      "T *immutable::ref<immutable::rrb_details::tree_node<char, false>>::operator->() const [T = immutable::rrb_details::tree_node<char, false>]"
      ;
LAB_00143f05:
      __assert_fail("ptr != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                    ,0x71a,pcVar9);
    }
    if (p_node->type == INTERNAL_NODE) {
      p_node->_ref_count = p_node->_ref_count + 1;
      prVar3 = (p_node->size_table).ptr;
      if (prVar3 == (rrb_size_table<false> *)0x0) {
        bVar8 = (byte)root_shift;
        local_34 = 1 << (bVar8 & 0x1f);
        uVar7 = p_node->len;
        if (uVar7 << (bVar8 & 0x1f) < expected_size) {
          pcVar9 = 
          "Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n";
LAB_00143df9:
          printf(pcVar9,uVar10);
        }
        else {
          if (expected_size < uVar7 - 1 << (bVar8 & 0x1f)) {
            pcVar9 = 
            "Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n"
            ;
            goto LAB_00143df9;
          }
          local_3c = root_shift - 5;
          uVar10 = 0;
          if (uVar7 != 1) {
            uVar11 = 0;
            local_38 = expected_size;
            do {
              local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar11].ptr;
              if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
                ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                     ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
              }
              bVar5 = validate_subtree<char,false,5>(&local_48,local_34,local_3c);
              ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
              if (!bVar5) goto LAB_00143e02;
              uVar11 = uVar11 + 1;
              uVar10 = (ulong)(p_node->len - 1);
              expected_size = local_38;
            } while (uVar11 < uVar10);
          }
          local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar10].ptr;
          if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
            ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                 ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
          }
          bVar6 = validate_subtree<char,false,5>
                            (&local_48,expected_size - ((int)uVar10 << (bVar8 & 0x1f)),local_3c);
          ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
          bVar5 = true;
          if (bVar6) goto LAB_00143eb7;
        }
LAB_00143e02:
        bVar5 = false;
      }
      else if (prVar3->size[p_node->len - 1] == expected_size) {
        if (p_node->len == 0) {
          bVar5 = true;
        }
        else {
          uVar10 = 0;
          do {
            prVar3 = (p_node->size_table).ptr;
            if (prVar3 == (rrb_size_table<false> *)0x0) {
              pcVar9 = 
              "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
              ;
              goto LAB_00143f05;
            }
            puVar4 = prVar3->size;
            if (uVar10 == 0) {
              uVar7 = 0;
            }
            else {
              uVar7 = puVar4[uVar10 - 1];
            }
            uVar1 = puVar4[uVar10];
            local_48.ptr = (tree_node<char,_false> *)p_node->child[uVar10].ptr;
            if ((internal_node<char,_false> *)local_48.ptr != (internal_node<char,_false> *)0x0) {
              ((internal_node<char,_false> *)local_48.ptr)->_ref_count =
                   ((internal_node<char,_false> *)local_48.ptr)->_ref_count + 1;
            }
            bVar5 = validate_subtree<char,false,5>(&local_48,uVar1 - uVar7,root_shift - 5);
            ref<immutable::rrb_details::tree_node<char,_false>_>::~ref(&local_48);
          } while ((bVar5) && (uVar10 = uVar10 + 1, uVar10 < p_node->len));
        }
      }
      else {
        bVar5 = false;
        printf("Expected subtree to be of size %u, but its size table says it is %u.\n",uVar10);
      }
LAB_00143eb7:
      release<char>(p_node);
      if (bVar5 != false) goto LAB_00143ec8;
    }
    else {
      puts("Expected this node to be an internal node, but it claims to be something else.");
      pcVar9 = "Will treat it like an internal node, so may segfault.";
LAB_00143d55:
      puts(pcVar9);
    }
LAB_00143da5:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool validate_subtree(const ref<tree_node<T, atomic_ref_counting>>& root, uint32_t expected_size, uint32_t root_shift)
      {
      if (root_shift == 0)
        { // leaf node
        if (root->type != LEAF_NODE)
          {
          printf("Expected this node to be a leaf node, but it claims to be something else.\n");
          printf("Will treat it like a leaf node, so may segfault.\n");
          return false;
          }
        ref<leaf_node<T, atomic_ref_counting>> leaf = root;
        if (leaf->len != expected_size)
          {
          printf("Leaf node claims to be %u elements long, but was expected to be %u\n elements long. Will attempt to read %u elements.\n",
            leaf->len, expected_size, std::max<uint32_t>(leaf->len, expected_size));
          return false;
          }
        }
      else
        {
        if (root->type != INTERNAL_NODE)
          {
          printf("Expected this node to be an internal node, but it claims to be something else.\n");
          printf("Will treat it like an internal node, so may segfault.\n");
          return false;
          }
        ref<internal_node<T, atomic_ref_counting>> internal = root;
        if (internal->size_table.ptr != nullptr)
          {
          // expected size should be consistent with what's in the last size table
          // slot
          if (internal->size_table->size[internal->len - 1] != expected_size)
            {
            printf("Expected subtree to be of size %u, but its size table says it is %u.\n", expected_size,
              internal->size_table->size[internal->len - 1]);
            return false;
            }
          for (uint32_t i = 0; i < internal->len; i++)
            {
            uint32_t size_sub_trie = internal->size_table->size[i] - (i == 0 ? 0 : internal->size_table->size[i - 1]);
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, size_sub_trie, root_shift - bits<N>::rrb_bits))
              return false;
            }
          }
        else
          {
          // internal->size_table == NULL
          // this tree may contain at most (internal->len << shift) elements, not
          // more. Effectively, the tree contains (len - 1) << shift + last_tree_len
          // (1 << shift) >= last_tree_len > 0
          const uint32_t child_shift = root_shift - bits<N>::rrb_bits;
          const uint32_t child_max_size = 1 << root_shift;

          if (expected_size > internal->len * child_max_size)
            {
            printf("Expected size (%u) is larger than what can possibly be inside this subtree: %u.\n", expected_size,
              internal->len * child_max_size);
            return false;
            }
          else if (expected_size < ((internal->len - 1) * child_max_size))
            {
            printf("Expected size (%u) is smaller than %u, implying that some non-rightmost node\n is not completely populated.\n",
              expected_size, ((internal->len - 1) << root_shift));
            return false;
            }
          for (uint32_t i = 0; i < internal->len - 1; i++)
            {
            ref<tree_node<T, atomic_ref_counting>> child = internal->child[i];
            if (!validate_subtree<T, atomic_ref_counting, N>(child, child_max_size, child_shift))
              return false;
            }
          ref<tree_node<T, atomic_ref_counting>> child = internal->child[internal->len - 1];
          if (!validate_subtree<T, atomic_ref_counting, N>(child, expected_size - ((internal->len - 1) * child_max_size), child_shift))
            return false;
          }
        }
      return true;
      }